

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

nifti_image * nifti_image_from_ascii(char *str,int *bytes_read)

{
  char cVar1;
  int iVar2;
  int iVar3;
  float dx;
  float dy;
  float dz;
  mat44 R;
  mat44 R_00;
  int iVar4;
  int iVar5;
  nifti_image *pnVar6;
  ushort **ppuVar7;
  size_t sVar8;
  uint uVar9;
  int iVar10;
  nifti_image *pnVar11;
  uint uVar12;
  int iVar13;
  char *pcVar14;
  char *pcVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  float fVar21;
  double dVar22;
  undefined1 auVar23 [16];
  float qc;
  float qd;
  float qx;
  float qy;
  float qz;
  float qfac;
  nifti_image *pnVar24;
  nifti_image *pnVar25;
  undefined4 in_stack_fffffffffffff668;
  uint in_stack_fffffffffffff66c;
  int in_stack_fffffffffffff678;
  int in_stack_fffffffffffff67c;
  mat44 *pmVar26;
  uint val;
  float fStack_874;
  float afStack_870 [2];
  float local_868 [2];
  float afStack_860 [2];
  float local_858 [2];
  float afStack_850 [2];
  float local_848 [2];
  float afStack_840 [2];
  char lhs [1024];
  char rhs [1024];
  
  if ((str != (char *)0x0) && (*str != '\0')) {
    iVar4 = __isoc99_sscanf(str,"%1023s%n",lhs,&stack0xfffffffffffff66c);
    if (iVar4 == 0) {
      return (nifti_image *)0x0;
    }
    if (CONCAT17(lhs[0xc],CONCAT16(lhs[0xb],CONCAT15(lhs[10],CONCAT14(lhs[9],CONCAT13(lhs[8],
                                                  CONCAT12(lhs[7],CONCAT11(lhs[6],lhs[5]))))))) ==
        0x6567616d695f69 &&
        CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[3],CONCAT12(lhs
                                                  [2],CONCAT11(lhs[1],lhs[0]))))))) ==
        0x695f697466696e3c) {
      uVar9 = in_stack_fffffffffffff66c;
      pnVar6 = (nifti_image *)calloc(1,0x2b8);
      if (pnVar6 != (nifti_image *)0x0) {
        pnVar6->nw = 1;
        pnVar6->nu = 1;
        pnVar6->nv = 1;
        pnVar6->nx = 1;
        pnVar6->ny = 1;
        pnVar6->nz = 1;
        pnVar6->nt = 1;
        pnVar6->dx = 0.0;
        pnVar6->dy = 0.0;
        pnVar6->dz = 0.0;
        pnVar6->dt = 0.0;
        pnVar6->dt = 0.0;
        pnVar6->du = 0.0;
        pnVar6->dv = 0.0;
        pnVar6->dw = 0.0;
        pnVar6->qfac = 1.0;
        pnVar6->byteorder = 1;
        ppuVar7 = __ctype_b_loc();
        pmVar26 = &pnVar6->sto_xyz;
        pnVar11 = pnVar6;
        pnVar24 = pnVar6;
        while( true ) {
          uVar19 = (ulong)(in_stack_fffffffffffff66c - 1);
          pcVar15 = str + (long)(int)in_stack_fffffffffffff66c + -1;
          uVar20 = in_stack_fffffffffffff66c;
          do {
            uVar12 = uVar20;
            in_stack_fffffffffffff66c = in_stack_fffffffffffff66c + 1;
            pcVar14 = pcVar15 + 1;
            pcVar15 = pcVar15 + 1;
            uVar16 = (int)uVar19 + 1;
            uVar19 = (ulong)uVar16;
            uVar20 = uVar12 + 1;
          } while ((*(byte *)((long)*ppuVar7 + (long)*pcVar14 * 2 + 1) & 0x20) != 0);
          if (*pcVar14 == '\0') goto LAB_0010e37b;
          iVar4 = __isoc99_sscanf(pcVar15,"%1023s%n",lhs,&stack0xfffffffffffff66c);
          if ((iVar4 == 0) || (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x3e2f)) break;
          lVar17 = (long)(int)(uVar12 + uVar9);
          pcVar15 = str + lVar17 + 1;
          uVar19 = lVar17 - 1;
          uVar20 = in_stack_fffffffffffff66c + uVar9;
          do {
            do {
              uVar12 = uVar20;
              uVar18 = uVar19;
              pcVar14 = pcVar15;
              cVar1 = str[uVar18 + 1];
              uVar19 = uVar18 + 1;
              uVar20 = uVar12 + 1;
              pcVar15 = pcVar14 + 1;
            } while ((long)cVar1 == 0x3d);
          } while (((*ppuVar7)[cVar1] & 0x2000) != 0);
          if (cVar1 == '\'') {
            uVar9 = 0xffffffff;
            do {
              in_stack_fffffffffffff66c = uVar12;
              cVar1 = *pcVar14;
              uVar12 = in_stack_fffffffffffff66c + 1;
              uVar9 = uVar9 + 1;
              if (cVar1 == '\'') break;
              pcVar14 = pcVar14 + 1;
            } while (cVar1 != '\0');
            if (0x3fe < (int)uVar9) {
              uVar9 = 0x3ff;
            }
            sVar8 = (size_t)(int)uVar9;
            pnVar11 = pnVar24;
            memcpy(rhs,str + uVar18 + 2,sVar8);
            rhs[sVar8] = '\0';
            pnVar24 = pnVar11;
            if (cVar1 == '\'') {
              in_stack_fffffffffffff66c = uVar12;
            }
          }
          else {
            if (cVar1 == '\0') goto LAB_0010e37b;
            iVar4 = __isoc99_sscanf(str + uVar19,"%1023s%n",rhs,&stack0xfffffffffffff66c);
            in_stack_fffffffffffff66c = uVar9 + (int)uVar19;
            if (iVar4 == 0) {
              uVar19 = (ulong)in_stack_fffffffffffff66c;
LAB_0010e37b:
              if (bytes_read != (int *)0x0) {
                *bytes_read = (int)uVar19 + 1;
              }
              if ((0 < pnVar11->ndim) &&
                 (nifti_datatype_sizes(pnVar11->datatype,&pnVar6->nbyper,&pnVar6->swapsize),
                 pnVar11->nbyper != 0)) {
                pnVar11->dim[0] = pnVar11->ndim;
                iVar4 = pnVar11->nx;
                pnVar11->dim[1] = iVar4;
                iVar5 = pnVar11->ny;
                pnVar11->dim[2] = iVar5;
                iVar10 = pnVar11->nz;
                pnVar11->dim[3] = iVar10;
                iVar13 = pnVar11->nt;
                pnVar11->dim[4] = iVar13;
                dx = pnVar11->dx;
                dy = pnVar11->dy;
                dz = pnVar11->dz;
                fVar21 = pnVar11->dt;
                pnVar11->pixdim[1] = dx;
                pnVar11->pixdim[2] = dy;
                pnVar11->pixdim[3] = dz;
                pnVar11->pixdim[4] = fVar21;
                iVar2 = pnVar11->nu;
                pnVar11->dim[5] = iVar2;
                iVar3 = pnVar11->nv;
                pnVar11->dim[6] = iVar3;
                fVar21 = pnVar11->dv;
                pnVar11->pixdim[5] = pnVar11->du;
                pnVar11->pixdim[6] = fVar21;
                pnVar11->dim[7] = pnVar11->nw;
                pnVar11->pixdim[7] = pnVar11->dw;
                pnVar11->nvox =
                     (long)iVar2 * (long)iVar3 * (long)pnVar11->nw *
                     (long)iVar10 * (long)iVar13 * (long)iVar5 * (long)iVar4;
                if (pnVar11->qform_code < 1) {
                  qfac = 0.0;
                  fVar21 = 0.0;
                  qc = 0.0;
                  qd = 0.0;
                  qx = 0.0;
                  qy = 0.0;
                  qz = 0.0;
                }
                else {
                  fVar21 = pnVar11->quatern_b;
                  qc = pnVar11->quatern_c;
                  qd = pnVar11->quatern_d;
                  qx = pnVar11->qoffset_x;
                  qy = pnVar11->qoffset_y;
                  qz = pnVar11->qoffset_z;
                  qfac = pnVar11->qfac;
                }
                nifti_quatern_to_mat44((mat44 *)&val,fVar21,qc,qd,qx,qy,qz,dx,dy,dz,qfac);
                *(float (*) [2])(pnVar6->qto_xyz).m[3] = local_848;
                *(float (*) [2])((pnVar6->qto_xyz).m[3] + 2) = afStack_840;
                *(float (*) [2])(pnVar6->qto_xyz).m[2] = local_858;
                *(float (*) [2])((pnVar6->qto_xyz).m[2] + 2) = afStack_850;
                *(float (*) [2])(pnVar6->qto_xyz).m[1] = local_868;
                *(float (*) [2])((pnVar6->qto_xyz).m[1] + 2) = afStack_860;
                *(ulong *)(pnVar6->qto_xyz).m[0] = CONCAT44(fStack_874,val);
                *(float (*) [2])((pnVar6->qto_xyz).m[0] + 2) = afStack_870;
                R.m[0][2] = (float)in_stack_fffffffffffff668;
                R.m[0]._0_8_ = pnVar24;
                R.m[0][3] = (float)uVar9;
                R.m[1]._0_8_ = ppuVar7;
                R.m[1][2] = (float)in_stack_fffffffffffff678;
                R.m[1][3] = (float)in_stack_fffffffffffff67c;
                R.m[2]._0_8_ = pmVar26;
                R.m[2]._8_8_ = *(undefined8 *)(pnVar11->qto_xyz).m[0];
                R.m[3]._0_8_ = *(undefined8 *)((pnVar11->qto_xyz).m[0] + 2);
                R.m[3]._8_8_ = *(undefined8 *)(pnVar11->qto_xyz).m[1];
                nifti_mat44_inverse(R);
                *(float (*) [2])(pnVar11->qto_ijk).m[3] = local_848;
                *(float (*) [2])((pnVar11->qto_ijk).m[3] + 2) = afStack_840;
                *(float (*) [2])(pnVar11->qto_ijk).m[2] = local_858;
                *(float (*) [2])((pnVar11->qto_ijk).m[2] + 2) = afStack_850;
                *(float (*) [2])(pnVar11->qto_ijk).m[1] = local_868;
                *(float (*) [2])((pnVar11->qto_ijk).m[1] + 2) = afStack_860;
                *(ulong *)(pnVar11->qto_ijk).m[0] = CONCAT44(fStack_874,val);
                *(float (*) [2])((pnVar11->qto_ijk).m[0] + 2) = afStack_870;
                if (0 < pnVar11->sform_code) {
                  R_00.m[0][2] = (float)in_stack_fffffffffffff668;
                  R_00.m[0]._0_8_ = pnVar24;
                  R_00.m[0][3] = (float)uVar9;
                  R_00.m[1]._0_8_ = ppuVar7;
                  R_00.m[1][2] = (float)in_stack_fffffffffffff678;
                  R_00.m[1][3] = (float)in_stack_fffffffffffff67c;
                  R_00.m[2]._0_8_ = pmVar26;
                  R_00.m[2]._8_8_ = *(undefined8 *)pmVar26->m[0];
                  R_00.m[3]._0_8_ = *(undefined8 *)(pmVar26->m[0] + 2);
                  R_00.m[3]._8_8_ = *(undefined8 *)pmVar26->m[1];
                  nifti_mat44_inverse(R_00);
                  *(float (*) [2])(pnVar11->sto_ijk).m[3] = local_848;
                  *(float (*) [2])((pnVar11->sto_ijk).m[3] + 2) = afStack_840;
                  *(float (*) [2])(pnVar11->sto_ijk).m[2] = local_858;
                  *(float (*) [2])((pnVar11->sto_ijk).m[2] + 2) = afStack_850;
                  *(float (*) [2])(pnVar11->sto_ijk).m[1] = local_868;
                  *(float (*) [2])((pnVar11->sto_ijk).m[1] + 2) = afStack_860;
                  *(ulong *)(pnVar11->sto_ijk).m[0] = CONCAT44(fStack_874,val);
                  *(float (*) [2])((pnVar11->sto_ijk).m[0] + 2) = afStack_870;
                  return pnVar11;
                }
                return pnVar11;
              }
              nifti_image_free(pnVar11);
              return (nifti_image *)0x0;
            }
          }
          sVar8 = strlen(rhs);
          iVar4 = (int)sVar8;
          if (iVar4 != 0) {
            if (iVar4 < 1) {
              uVar19 = 0;
            }
            else {
              in_stack_fffffffffffff67c = iVar4 + -3;
              in_stack_fffffffffffff678 = iVar4 + -4;
              uVar19 = 0;
              iVar5 = 0;
              do {
                lVar17 = (long)iVar5;
                cVar1 = rhs[lVar17];
                iVar10 = iVar5;
                if (cVar1 == '\r') {
                  cVar1 = rhs[lVar17 + 1];
                  rhs[uVar19] = '\n';
                  if (cVar1 == '\n') {
                    iVar10 = iVar5 + 1;
                  }
                }
                else if (cVar1 == '&') {
                  iVar13 = iVar5 + 3;
                  if (iVar13 < iVar4) {
                    iVar10 = iVar13;
                    if (rhs[lVar17 + 1] == 'g') {
                      if ((rhs[lVar17 + 2] != 't') || (rhs[iVar13] != ';')) goto LAB_0010d31b;
                      rhs[uVar19] = '>';
                    }
                    else {
                      if (((rhs[lVar17 + 1] != 'l') || (rhs[lVar17 + 2] != 't')) ||
                         (rhs[iVar13] != ';')) goto LAB_0010d31b;
                      rhs[uVar19] = '<';
                    }
                  }
                  else {
LAB_0010d31b:
                    iVar10 = iVar5 + 5;
                    if (iVar10 < iVar4) {
                      if (rhs[lVar17 + 1] == 'a') {
                        if (((rhs[lVar17 + 2] != 'p') || (rhs[iVar13] != 'o')) ||
                           ((rhs[lVar17 + 4] != 's' || (rhs[lVar17 + 5] != ';'))))
                        goto LAB_0010d393;
                        rhs[uVar19] = '\'';
                      }
                      else {
                        if (((rhs[lVar17 + 1] != 'q') || (rhs[lVar17 + 2] != 'u')) ||
                           ((rhs[iVar13] != 'o' ||
                            ((rhs[lVar17 + 4] != 't' || (rhs[lVar17 + 5] != ';'))))))
                        goto LAB_0010d393;
                        rhs[uVar19] = '\"';
                      }
                    }
                    else {
LAB_0010d393:
                      iVar10 = iVar5 + 4;
                      if ((iVar10 < iVar4) &&
                         ((((rhs[lVar17 + 1] == 'a' && (rhs[lVar17 + 2] == 'm')) &&
                           (rhs[iVar13] == 'p')) && (rhs[iVar10] == ';')))) {
                        rhs[uVar19] = '&';
                      }
                      else {
                        if (((iVar13 < iVar4) && (rhs[lVar17 + 1] == '#')) &&
                           ((*(byte *)((long)*ppuVar7 + (long)rhs[lVar17 + 2] * 2 + 1) & 8) != 0)) {
                          pcVar15 = rhs + 2;
                          uVar20 = 0x38U - iVar5;
                          if ((uint)(in_stack_fffffffffffff67c - iVar5) < 0x38U - iVar5) {
                            uVar20 = in_stack_fffffffffffff67c - iVar5;
                          }
                          iVar10 = iVar13 + uVar20;
                          pcVar14 = "%u";
                        }
                        else {
                          if (((iVar4 <= iVar10) || (rhs[lVar17 + 1] != '#')) ||
                             ((rhs[lVar17 + 2] != 'x' ||
                              ((*(byte *)((long)*ppuVar7 + (long)rhs[iVar13] * 2 + 1) & 0x10) == 0))
                             )) {
                            iVar10 = iVar5;
                            if ((long)uVar19 < lVar17) {
                              rhs[uVar19] = '&';
                            }
                            goto LAB_0010d42b;
                          }
                          uVar20 = 0x37U - iVar5;
                          if ((uint)(in_stack_fffffffffffff678 - iVar5) < 0x37U - iVar5) {
                            uVar20 = in_stack_fffffffffffff678 - iVar5;
                          }
                          iVar10 = uVar20 + iVar10;
                          pcVar15 = rhs + 3;
                          pcVar14 = "%x";
                        }
                        val = 0x3f;
                        __isoc99_sscanf(pcVar15 + lVar17,pcVar14,&val);
                        rhs[uVar19] = (char)val;
                      }
                    }
                  }
                }
                else if ((long)uVar19 < lVar17) {
                  rhs[uVar19] = cVar1;
                }
LAB_0010d42b:
                iVar5 = iVar10 + 1;
                uVar19 = uVar19 + 1;
              } while (iVar5 < iVar4);
            }
            if ((int)uVar19 < iVar4) {
              rhs[uVar19 & 0xffffffff] = '\0';
            }
          }
          if (CONCAT17(lhs[10],CONCAT16(lhs[9],CONCAT15(lhs[8],CONCAT14(lhs[7],CONCAT13(lhs[6],
                                                  CONCAT12(lhs[5],CONCAT11(lhs[4],lhs[3]))))))) ==
              0x657079745f6974 &&
              CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[3],
                                                  CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0]))))))) ==
              0x79745f697466696e) {
            if (rhs._8_4_ == 0x352e37 && rhs._0_8_ == 0x2d455a594c414e41) {
              pnVar11->nifti_type = 0;
            }
            else if (rhs[8] == '\0' && rhs._0_8_ == 0x2b312d495446494e) {
              pnVar11->nifti_type = 1;
            }
            else if (rhs._0_8_ == 0x312d495446494e) {
              pnVar11->nifti_type = 2;
            }
            else if (rhs[8] == '\0' && rhs._0_8_ == 0x41312d495446494e) {
              pnVar11->nifti_type = 3;
            }
          }
          else {
            auVar23[0] = -(lhs[0] == 'h');
            auVar23[1] = -(lhs[1] == 'e');
            auVar23[2] = -(lhs[2] == 'a');
            auVar23[3] = -(lhs[3] == 'd');
            auVar23[4] = -(lhs[4] == 'e');
            auVar23[5] = -(lhs[5] == 'r');
            auVar23[6] = -(lhs[6] == '_');
            auVar23[7] = -(lhs[7] == 'f');
            auVar23[8] = -(lhs[8] == 'i');
            auVar23[9] = -(lhs[9] == 'l');
            auVar23[10] = -(lhs[10] == 'e');
            auVar23[0xb] = -(lhs[0xb] == 'n');
            auVar23[0xc] = -(lhs[0xc] == 'a');
            auVar23[0xd] = -(lhs[0xd] == 'm');
            auVar23[0xe] = -(lhs[0xe] == 'e');
            auVar23[0xf] = -(lhs[0xf] == '\0');
            if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar23[0xf] >> 7) << 0xf) == 0xffff) {
              pcVar15 = nifti_strdup(rhs);
              pnVar11->fname = pcVar15;
            }
            else if (CONCAT17(lhs[0xe],CONCAT16(lhs[0xd],CONCAT15(lhs[0xc],CONCAT14(lhs[0xb],
                                                  CONCAT13(lhs[10],CONCAT12(lhs[9],CONCAT11(lhs[8],
                                                  lhs[7]))))))) == 0x656d616e656c69 &&
                     CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[3]
                                                  ,CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0]))))))) ==
                     0x69665f6567616d69) {
              pcVar15 = nifti_strdup(rhs);
              pnVar11->iname = pcVar15;
            }
            else if (CONCAT17(lhs[0xe],CONCAT16(lhs[0xd],CONCAT15(lhs[0xc],CONCAT14(lhs[0xb],
                                                  CONCAT13(lhs[10],CONCAT12(lhs[9],CONCAT11(lhs[8],
                                                  lhs[7]))))))) == 0x78697274616d5f &&
                     CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[3]
                                                  ,CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0]))))))) ==
                     0x5f7a79785f6f7473) {
              __isoc99_sscanf(rhs,"%f %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f",pmVar26,
                              (pnVar6->sto_xyz).m[0] + 1,(pnVar6->sto_xyz).m[0] + 2,
                              (pnVar6->sto_xyz).m[0] + 3,(pnVar6->sto_xyz).m + 1,
                              (pnVar6->sto_xyz).m[1] + 1,(pnVar6->sto_xyz).m[1] + 2,
                              (pnVar6->sto_xyz).m[1] + 3,(pnVar6->sto_xyz).m + 2,
                              (pnVar6->sto_xyz).m[2] + 1,(pnVar6->sto_xyz).m[2] + 2,
                              (pnVar6->sto_xyz).m[2] + 3,(pnVar6->sto_xyz).m + 3,
                              (pnVar6->sto_xyz).m[3] + 1,(pnVar6->sto_xyz).m[3] + 2,
                              (pnVar6->sto_xyz).m[3] + 3);
            }
            else if (CONCAT11(lhs[9],lhs[8]) == 0x72 &&
                     CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[3]
                                                  ,CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0]))))))) ==
                     0x6564726f65747962) {
              if (rhs._8_2_ == 0x54 && rhs._0_8_ == 0x535249465f42534d) {
                pnVar11->byteorder = 2;
              }
              if (rhs._8_2_ == 0x54 && rhs._0_8_ == 0x535249465f42534c) {
                pnVar11->byteorder = 1;
              }
            }
            else if (CONCAT17(lhs[0xc],CONCAT16(lhs[0xb],CONCAT15(lhs[10],CONCAT14(lhs[9],CONCAT13(
                                                  lhs[8],CONCAT12(lhs[7],CONCAT11(lhs[6],lhs[5])))))
                                               )) == 0x74657366666f5f &&
                     CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[3]
                                                  ,CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0]))))))) ==
                     0x666f5f6567616d69) {
              dVar22 = strtod(rhs,(char **)0x0);
              pnVar11->iname_offset = (int)dVar22;
            }
            else if (lhs[8] == '\0' &&
                     CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[3]
                                                  ,CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0]))))))) ==
                     0x6570797461746164) {
              dVar22 = strtod(rhs,(char **)0x0);
              pnVar11->datatype = (int)(short)(int)dVar22;
            }
            else if (lhs[4] == '\0' &&
                     CONCAT13(lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0]))) == 0x6d69646e) {
              dVar22 = strtod(rhs,(char **)0x0);
              pnVar11->ndim = (int)dVar22;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x786e) {
              dVar22 = strtod(rhs,(char **)0x0);
              pnVar11->nx = (int)dVar22;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x796e) {
              dVar22 = strtod(rhs,(char **)0x0);
              pnVar11->ny = (int)dVar22;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x7a6e) {
              dVar22 = strtod(rhs,(char **)0x0);
              pnVar11->nz = (int)dVar22;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x746e) {
              dVar22 = strtod(rhs,(char **)0x0);
              pnVar11->nt = (int)dVar22;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x756e) {
              dVar22 = strtod(rhs,(char **)0x0);
              pnVar11->nu = (int)dVar22;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x766e) {
              dVar22 = strtod(rhs,(char **)0x0);
              pnVar11->nv = (int)dVar22;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x776e) {
              dVar22 = strtod(rhs,(char **)0x0);
              pnVar11->nw = (int)dVar22;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x7864) {
              dVar22 = strtod(rhs,(char **)0x0);
              pnVar6->dx = (float)dVar22;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x7964) {
              dVar22 = strtod(rhs,(char **)0x0);
              pnVar11->dy = (float)dVar22;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x7a64) {
              dVar22 = strtod(rhs,(char **)0x0);
              pnVar11->dz = (float)dVar22;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x7464) {
              dVar22 = strtod(rhs,(char **)0x0);
              pnVar11->dt = (float)dVar22;
            }
            else {
              pnVar11 = pnVar24;
              if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x7564) {
                dVar22 = strtod(rhs,(char **)0x0);
                pnVar11->du = (float)dVar22;
                pnVar24 = pnVar11;
              }
              else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x7664) {
                dVar22 = strtod(rhs,(char **)0x0);
                pnVar11->dv = (float)dVar22;
                pnVar24 = pnVar11;
              }
              else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x7764) {
                dVar22 = strtod(rhs,(char **)0x0);
                pnVar11->dw = (float)dVar22;
                pnVar24 = pnVar11;
              }
              else {
                lVar17 = CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 ));
                if (lVar17 == 0x78616d5f6c6163) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->cal_max = (float)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (lVar17 == 0x6e696d5f6c6163) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar24->cal_min = (float)dVar22;
                  pnVar11 = pnVar24;
                }
                else if (CONCAT11(lhs[9],lhs[8]) == 0x65 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x706f6c735f6c6373) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->scl_slope = (float)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT11(lhs[9],lhs[8]) == 0x72 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x65746e695f6c6373) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->scl_inter = (float)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT13(lhs[0xb],CONCAT12(lhs[10],CONCAT11(lhs[9],lhs[8]))) == 0x65646f &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x635f746e65746e69) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->intent_code = (int)(short)(int)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT11(lhs[9],lhs[8]) == 0x31 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x705f746e65746e69) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->intent_p1 = (float)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT11(lhs[9],lhs[8]) == 0x32 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x705f746e65746e69) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->intent_p2 = (float)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT11(lhs[9],lhs[8]) == 0x33 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x705f746e65746e69) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->intent_p3 = (float)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT13(lhs[0xb],CONCAT12(lhs[10],CONCAT11(lhs[9],lhs[8]))) == 0x656d61 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x6e5f746e65746e69) {
                  strncpy(pnVar6->intent_name,rhs,0xf);
                  pnVar11->intent_name[0xf] = '\0';
                  pnVar24 = pnVar11;
                }
                else if (lVar17 == 0x74657366666f74) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar24->toffset = (float)dVar22;
                  pnVar11 = pnVar24;
                }
                else if (CONCAT11(lhs[9],lhs[8]) == 0x73 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x74696e755f7a7978) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->xyz_units = (int)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT17(lhs[10],CONCAT16(lhs[9],CONCAT15(lhs[8],CONCAT14(lhs[7],CONCAT13(
                                                  lhs[6],CONCAT12(lhs[5],CONCAT11(lhs[4],lhs[3])))))
                                                  )) == 0x7374696e755f65 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x696e755f656d6974) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->time_units = (int)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (lVar17 == 0x70697263736564) {
                  strncpy(pnVar6->descrip,rhs,0x4f);
                  pnVar24->descrip[0x4f] = '\0';
                  pnVar11 = pnVar24;
                }
                else if (lhs[8] == '\0' &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x656c69665f787561) {
                  strncpy(pnVar6->aux_file,rhs,0x17);
                  pnVar11->aux_file[0x17] = '\0';
                  pnVar24 = pnVar11;
                }
                else if (CONCAT17(lhs[10],CONCAT16(lhs[9],CONCAT15(lhs[8],CONCAT14(lhs[7],CONCAT13(
                                                  lhs[6],CONCAT12(lhs[5],CONCAT11(lhs[4],lhs[3])))))
                                                  )) == 0x65646f635f6d72 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x6f635f6d726f6671) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->qform_code = (int)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT11(lhs[9],lhs[8]) == 0x62 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x5f6e726574617571) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->quatern_b = (float)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT11(lhs[9],lhs[8]) == 99 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x5f6e726574617571) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->quatern_c = (float)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT11(lhs[9],lhs[8]) == 100 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x5f6e726574617571) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->quatern_d = (float)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT11(lhs[9],lhs[8]) == 0x78 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x5f74657366666f71) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->qoffset_x = (float)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT11(lhs[9],lhs[8]) == 0x79 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x5f74657366666f71) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->qoffset_y = (float)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT11(lhs[9],lhs[8]) == 0x7a &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x5f74657366666f71) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->qoffset_z = (float)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (lhs[4] == '\0' &&
                         CONCAT13(lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0]))) == 0x63616671) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->qfac = (float)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT17(lhs[10],CONCAT16(lhs[9],CONCAT15(lhs[8],CONCAT14(lhs[7],CONCAT13(
                                                  lhs[6],CONCAT12(lhs[5],CONCAT11(lhs[4],lhs[3])))))
                                                  )) == 0x65646f635f6d72 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x6f635f6d726f6673) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->sform_code = (int)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (lhs[8] == '\0' &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x6d69645f71657266) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->freq_dim = (int)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT11(lhs[9],lhs[8]) == 0x6d &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x69645f6573616870) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->phase_dim = (int)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT11(lhs[9],lhs[8]) == 0x6d &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x69645f6563696c73) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->slice_dim = (int)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT17(lhs[10],CONCAT16(lhs[9],CONCAT15(lhs[8],CONCAT14(lhs[7],CONCAT13(
                                                  lhs[6],CONCAT12(lhs[5],CONCAT11(lhs[4],lhs[3])))))
                                                  )) == 0x65646f635f6563 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x6f635f6563696c73) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->slice_code = (int)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT13(lhs[0xb],CONCAT12(lhs[10],CONCAT11(lhs[9],lhs[8]))) == 0x747261 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x74735f6563696c73) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->slice_start = (int)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT11(lhs[9],lhs[8]) == 100 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x6e655f6563696c73) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->slice_end = (int)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (CONCAT17(lhs[0xe],CONCAT16(lhs[0xd],CONCAT15(lhs[0xc],CONCAT14(lhs[0xb],
                                                  CONCAT13(lhs[10],CONCAT12(lhs[9],CONCAT11(lhs[8],
                                                  lhs[7]))))))) == 0x6e6f6974617275 &&
                         CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(
                                                  lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))
                                                 )) == 0x75645f6563696c73) {
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar11->slice_duration = (float)dVar22;
                  pnVar24 = pnVar11;
                }
                else if (lVar17 == 0x7478655f6d756e) {
                  pnVar25 = pnVar24;
                  dVar22 = strtod(rhs,(char **)0x0);
                  pnVar24->num_ext = (int)dVar22;
                  pnVar24 = pnVar25;
                }
              }
            }
          }
        }
        uVar19 = (ulong)(uVar9 + uVar16);
        goto LAB_0010e37b;
      }
      nifti_image_from_ascii_cold_1();
    }
  }
  return (nifti_image *)0x0;
}

Assistant:

nifti_image *nifti_image_from_ascii( const char *str, int * bytes_read )
{
   char lhs[1024] , rhs[1024] ;
   int ii , spos, nn ;
   nifti_image *nim ;              /* will be output */

   if( str == NULL || *str == '\0' ) return NULL ;  /* bad input!? */

   /* scan for opening string */

   spos = 0 ; 
   ii = sscanf( str+spos , "%1023s%n" , lhs , &nn ) ; spos += nn ;
   if( ii == 0 || strcmp(lhs,"<nifti_image") != 0 ) return NULL ;

   /* create empty image struct */

   nim = (nifti_image *)calloc( 1 , sizeof(nifti_image) ) ;
   if( !nim ){
      fprintf(stderr,"** NIFA: failed to alloc nifti_image\n");
      return NULL;
   }

   nim->nx = nim->ny = nim->nz = nim->nt
           = nim->nu = nim->nv = nim->nw = 1 ;
   nim->dx = nim->dy = nim->dz = nim->dt
           = nim->du = nim->dv = nim->dw = 0 ;
   nim->qfac = 1.0f ;

   nim->byteorder = nifti_short_order() ;

   /* starting at str[spos], scan for "equations" of the form
         lhs = 'rhs'
      and assign rhs values into the struct component named by lhs */

   while(1){

     while( isspace((int) str[spos]) ) spos++ ;  /* skip whitespace */
     if( str[spos] == '\0' ) break ;       /* end of string? */

     /* get lhs string */

     ii = sscanf( str+spos , "%1023s%n" , lhs , &nn ) ; spos += nn ;
     if( ii == 0 || strcmp(lhs,"/>") == 0 ) break ;  /* end of input? */

     /* skip whitespace and the '=' marker */

     while( isspace((int) str[spos]) || str[spos] == '=' ) spos++ ;
     if( str[spos] == '\0' ) break ;       /* end of string? */

     /* if next character is a quote ', copy everything up to next '
        otherwise, copy everything up to next nonblank              */

     if( str[spos] == '\'' ){
        ii = spos+1 ;
        while( str[ii] != '\0' && str[ii] != '\'' ) ii++ ;
        nn = ii-spos-1 ; if( nn > 1023 ) nn = 1023 ;
        memcpy(rhs,str+spos+1,nn) ; rhs[nn] = '\0' ;
        spos = (str[ii] == '\'') ? ii+1 : ii ;
     } else {
        ii = sscanf( str+spos , "%1023s%n" , rhs , &nn ) ; spos += nn ;
        if( ii == 0 ) break ;  /* nothing found? */
     }
     unescape_string(rhs) ;  /* remove any XML escape sequences */

     /* Now can do the assignment, based on lhs string.
        Start with special cases that don't fit the QNUM/QSTR macros. */

     if( strcmp(lhs,"nifti_type") == 0 ){
            if( strcmp(rhs,"ANALYZE-7.5") == 0 )
               nim->nifti_type = NIFTI_FTYPE_ANALYZE ;
       else if( strcmp(rhs,"NIFTI-1+")    == 0 )
               nim->nifti_type = NIFTI_FTYPE_NIFTI1_1 ;
       else if( strcmp(rhs,"NIFTI-1")     == 0 )
               nim->nifti_type = NIFTI_FTYPE_NIFTI1_2 ;
       else if( strcmp(rhs,"NIFTI-1A")    == 0 )
               nim->nifti_type = NIFTI_FTYPE_ASCII ;
     }
     else if( strcmp(lhs,"header_filename") == 0 ){
       nim->fname = nifti_strdup(rhs) ;
     }
     else if( strcmp(lhs,"image_filename") == 0 ){
       nim->iname = nifti_strdup(rhs) ;
     }
     else if( strcmp(lhs,"sto_xyz_matrix") == 0 ){
       sscanf( rhs , "%f %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f" ,
               &(nim->sto_xyz.m[0][0]) , &(nim->sto_xyz.m[0][1]) ,
               &(nim->sto_xyz.m[0][2]) , &(nim->sto_xyz.m[0][3]) ,
               &(nim->sto_xyz.m[1][0]) , &(nim->sto_xyz.m[1][1]) ,
               &(nim->sto_xyz.m[1][2]) , &(nim->sto_xyz.m[1][3]) ,
               &(nim->sto_xyz.m[2][0]) , &(nim->sto_xyz.m[2][1]) ,
               &(nim->sto_xyz.m[2][2]) , &(nim->sto_xyz.m[2][3]) ,
               &(nim->sto_xyz.m[3][0]) , &(nim->sto_xyz.m[3][1]) ,
               &(nim->sto_xyz.m[3][2]) , &(nim->sto_xyz.m[3][3])  ) ;
     }
     else if( strcmp(lhs,"byteorder") == 0 ){
       if( strcmp(rhs,"MSB_FIRST") == 0 ) nim->byteorder = MSB_FIRST ;
       if( strcmp(rhs,"LSB_FIRST") == 0 ) nim->byteorder = LSB_FIRST ;
     }
     else QQNUM(image_offset,iname_offset,int) ;
     else QNUM(datatype,short int) ;
     else QNUM(ndim,int) ;
     else QNUM(nx,int) ;
     else QNUM(ny,int) ;
     else QNUM(nz,int) ;
     else QNUM(nt,int) ;
     else QNUM(nu,int) ;
     else QNUM(nv,int) ;
     else QNUM(nw,int) ;
     else QNUM(dx,float) ;
     else QNUM(dy,float) ;
     else QNUM(dz,float) ;
     else QNUM(dt,float) ;
     else QNUM(du,float) ;
     else QNUM(dv,float) ;
     else QNUM(dw,float) ;
     else QNUM(cal_min,float) ;
     else QNUM(cal_max,float) ;
     else QNUM(scl_slope,float) ;
     else QNUM(scl_inter,float) ;
     else QNUM(intent_code,short) ;
     else QNUM(intent_p1,float) ;
     else QNUM(intent_p2,float) ;
     else QNUM(intent_p3,float) ;
     else QSTR(intent_name,15) ;
     else QNUM(toffset,float) ;
     else QNUM(xyz_units,int) ;
     else QNUM(time_units,int) ;
     else QSTR(descrip,79) ;
     else QSTR(aux_file,23) ;
     else QNUM(qform_code,int) ;
     else QNUM(quatern_b,float) ;
     else QNUM(quatern_c,float) ;
     else QNUM(quatern_d,float) ;
     else QNUM(qoffset_x,float) ;
     else QNUM(qoffset_y,float) ;
     else QNUM(qoffset_z,float) ;
     else QNUM(qfac,float) ;
     else QNUM(sform_code,int) ;
     else QNUM(freq_dim,int) ;
     else QNUM(phase_dim,int) ;
     else QNUM(slice_dim,int) ;
     else QNUM(slice_code,int) ;
     else QNUM(slice_start,int) ;
     else QNUM(slice_end,int) ;
     else QNUM(slice_duration,float) ;
     else QNUM(num_ext,int) ;

   } /* end of while loop */

   if( bytes_read ) *bytes_read = spos+1;         /* "process" last '\n' */

   /* do miscellaneous checking and cleanup */

   if( nim->ndim <= 0 ){ nifti_image_free(nim); return NULL; } /* bad! */

   nifti_datatype_sizes( nim->datatype, &(nim->nbyper), &(nim->swapsize) );
   if( nim->nbyper == 0 ){ nifti_image_free(nim); return NULL; } /* bad! */

   nim->dim[0] = nim->ndim ;
   nim->dim[1] = nim->nx ; nim->pixdim[1] = nim->dx ;
   nim->dim[2] = nim->ny ; nim->pixdim[2] = nim->dy ;
   nim->dim[3] = nim->nz ; nim->pixdim[3] = nim->dz ;
   nim->dim[4] = nim->nt ; nim->pixdim[4] = nim->dt ;
   nim->dim[5] = nim->nu ; nim->pixdim[5] = nim->du ;
   nim->dim[6] = nim->nv ; nim->pixdim[6] = nim->dv ;
   nim->dim[7] = nim->nw ; nim->pixdim[7] = nim->dw ;

   nim->nvox = (size_t)nim->nx * nim->ny * nim->nz
                     * nim->nt * nim->nu * nim->nv * nim->nw ;

   if( nim->qform_code > 0 )
     nim->qto_xyz = nifti_quatern_to_mat44(
                      nim->quatern_b, nim->quatern_c, nim->quatern_d,
                      nim->qoffset_x, nim->qoffset_y, nim->qoffset_z,
                      nim->dx       , nim->dy       , nim->dz       ,
                      nim->qfac                                      ) ;
   else
     nim->qto_xyz = nifti_quatern_to_mat44(
                      0.0f , 0.0f , 0.0f , 0.0f , 0.0f , 0.0f ,
                      nim->dx , nim->dy , nim->dz , 0.0f ) ;


   nim->qto_ijk = nifti_mat44_inverse( nim->qto_xyz ) ;

   if( nim->sform_code > 0 )
     nim->sto_ijk = nifti_mat44_inverse( nim->sto_xyz ) ;

   return nim ;
}